

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O0

void duckdb_fastpforlib::internal::fastunpack_half(uint16_t *in,uint16_t *out,uint32_t bit)

{
  uint16_t *in_00;
  logic_error *this;
  uint in_EDX;
  uint16_t *in_RSI;
  uint16_t *in_RDI;
  uint16_t *in_stack_ffffffffffffffc8;
  
  in_00 = (uint16_t *)(ulong)in_EDX;
  switch(in_00) {
  case (uint16_t *)0x0:
    __fastunpack0(in_RDI,in_RSI);
    break;
  case (uint16_t *)0x1:
    __fastunpack1(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0x2:
    __fastunpack2(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0x3:
    __fastunpack3(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0x4:
    __fastunpack4(in_RDI,in_RSI);
    break;
  case (uint16_t *)0x5:
    __fastunpack5(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0x6:
    __fastunpack6(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0x7:
    __fastunpack7(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0x8:
    __fastunpack8(in_RDI,in_RSI);
    break;
  case (uint16_t *)0x9:
    __fastunpack9(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0xa:
    __fastunpack10(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0xb:
    __fastunpack11(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0xc:
    __fastunpack12(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0xd:
    __fastunpack13(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0xe:
    __fastunpack14(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0xf:
    __fastunpack15(in_00,in_stack_ffffffffffffffc8);
    break;
  case (uint16_t *)0x10:
    __fastunpack16(in_RDI,in_RSI);
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid bit width for bitpacking");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

inline void fastunpack_half(const uint16_t *__restrict in, uint16_t *__restrict out, const uint32_t bit) {
	// Could have used function pointers instead of switch.
	// Switch calls do offer the compiler more opportunities for optimization in
	// theory. In this case, it makes no difference with a good compiler.
	switch (bit) {
	case 0:
		internal::__fastunpack0(in, out);
		break;
	case 1:
		internal::__fastunpack1(in, out);
		break;
	case 2:
		internal::__fastunpack2(in, out);
		break;
	case 3:
		internal::__fastunpack3(in, out);
		break;
	case 4:
		internal::__fastunpack4(in, out);
		break;
	case 5:
		internal::__fastunpack5(in, out);
		break;
	case 6:
		internal::__fastunpack6(in, out);
		break;
	case 7:
		internal::__fastunpack7(in, out);
		break;
	case 8:
		internal::__fastunpack8(in, out);
		break;
	case 9:
		internal::__fastunpack9(in, out);
		break;
	case 10:
		internal::__fastunpack10(in, out);
		break;
	case 11:
		internal::__fastunpack11(in, out);
		break;
	case 12:
		internal::__fastunpack12(in, out);
		break;
	case 13:
		internal::__fastunpack13(in, out);
		break;
	case 14:
		internal::__fastunpack14(in, out);
		break;
	case 15:
		internal::__fastunpack15(in, out);
		break;
	case 16:
		internal::__fastunpack16(in, out);
		break;
	default:
		throw std::logic_error("Invalid bit width for bitpacking");
	}
}